

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<long,long>::
Update<duckdb::BitpackingCompressionState<long,true,long>::BitpackingWriter>
          (BitpackingState<long,long> *this,long value,bool is_valid)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = *(long *)(this + 0x8810);
  this[lVar2 + 0x8010] = (BitpackingState<long,long>)is_valid;
  this[0x8860] = (BitpackingState<long,long>)((byte)this[0x8860] & is_valid);
  this[0x8861] = (BitpackingState<long,long>)((byte)this[0x8861] & !is_valid);
  if (is_valid) {
    *(long *)(*(long *)(this + 0x4008) + lVar2 * 8) = value;
    lVar2 = *(long *)(this + 0x8810);
    lVar3 = *(long *)(this + 0x8828);
    if (value <= *(long *)(this + 0x8828)) {
      lVar3 = value;
    }
    *(long *)(this + 0x8828) = lVar3;
    if (value < *(long *)(this + 0x8830)) {
      value = *(long *)(this + 0x8830);
    }
    *(long *)(this + 0x8830) = value;
  }
  *(long *)(this + 0x8810) = lVar2 + 1;
  if (lVar2 + 1 == 0x800) {
    bVar1 = Flush<duckdb::BitpackingCompressionState<long,true,long>::BitpackingWriter>(this);
    BitpackingState<long,_long>::Reset((BitpackingState<long,_long> *)this);
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}